

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O2

char * cpio_rename(char *name)

{
  char cVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  
  __stream = fopen("/dev/tty","r+");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"%s (Enter/./(new name))? ",name);
    fflush(__stream);
    pcVar2 = fgets(cpio_rename::buff,0x400,__stream);
    fclose(__stream);
    if (pcVar2 != (char *)0x0) {
      do {
        do {
          pcVar3 = pcVar2;
          pcVar2 = pcVar3 + 1;
          cVar1 = *pcVar3;
        } while (cVar1 == '\t');
      } while (cVar1 == ' ');
      if ((cVar1 != '\0') && (cVar1 != '\n')) {
        if ((cVar1 == '.') && (*pcVar2 == '\n')) {
          return name;
        }
        while ((cVar1 != '\0' && (cVar1 != '\n'))) {
          cVar1 = *pcVar2;
          pcVar2 = pcVar2 + 1;
        }
        pcVar2[-1] = '\0';
        return pcVar3;
      }
    }
    name = (char *)0x0;
  }
  return name;
}

Assistant:

static const char *
cpio_rename(const char *name)
{
	static char buff[1024];
	FILE *t;
	char *p, *ret;
#if defined(_WIN32) && !defined(__CYGWIN__)
	FILE *to;

	t = fopen("CONIN$", "r");
	if (t == NULL)
		return (name);
	to = fopen("CONOUT$", "w");
	if (to == NULL) {
		fclose(t);
		return (name);
	}
	fprintf(to, "%s (Enter/./(new name))? ", name);
	fclose(to);
#else
	t = fopen("/dev/tty", "r+");
	if (t == NULL)
		return (name);
	fprintf(t, "%s (Enter/./(new name))? ", name);
	fflush(t);
#endif

	p = fgets(buff, sizeof(buff), t);
	fclose(t);
	if (p == NULL)
		/* End-of-file is a blank line. */
		return (NULL);

	while (*p == ' ' || *p == '\t')
		++p;
	if (*p == '\n' || *p == '\0')
		/* Empty line. */
		return (NULL);
	if (*p == '.' && p[1] == '\n')
		/* Single period preserves original name. */
		return (name);
	ret = p;
	/* Trim the final newline. */
	while (*p != '\0' && *p != '\n')
		++p;
	/* Overwrite the final \n with a null character. */
	*p = '\0';
	return (ret);
}